

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void pffft_cplx_preprocess(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  v4sf tmp_2;
  v4sf tmp_1;
  v4sf tmp;
  v4sf di1;
  v4sf si1;
  v4sf di0;
  v4sf si0;
  v4sf dr1;
  v4sf sr1;
  v4sf dr0;
  v4sf sr0;
  v4sf i3;
  v4sf r3;
  v4sf i2;
  v4sf r2;
  v4sf i1;
  v4sf r1;
  v4sf i0;
  v4sf r0;
  int local_66c;
  int dk;
  int k;
  v4sf *e_local;
  v4sf *out_local;
  v4sf *in_local;
  int Ncvec_local;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  
  if (in != out) {
    e_local = out;
    for (local_66c = 0; local_66c < Ncvec / 4; local_66c = local_66c + 1) {
      uVar1 = *(undefined8 *)in[local_66c << 3];
      uVar2 = *(undefined8 *)(in[local_66c << 3] + 2);
      uVar3 = *(undefined8 *)in[local_66c * 8 + 1];
      uVar4 = *(undefined8 *)(in[local_66c * 8 + 1] + 2);
      uVar5 = *(undefined8 *)in[local_66c * 8 + 2];
      uVar6 = *(undefined8 *)(in[local_66c * 8 + 2] + 2);
      uVar7 = *(undefined8 *)in[local_66c * 8 + 3];
      uVar8 = *(undefined8 *)(in[local_66c * 8 + 3] + 2);
      uVar9 = *(undefined8 *)in[local_66c * 8 + 4];
      uVar10 = *(undefined8 *)(in[local_66c * 8 + 4] + 2);
      uVar11 = *(undefined8 *)in[local_66c * 8 + 5];
      uVar12 = *(undefined8 *)(in[local_66c * 8 + 5] + 2);
      uVar13 = *(undefined8 *)in[local_66c * 8 + 6];
      uVar14 = *(undefined8 *)(in[local_66c * 8 + 6] + 2);
      uVar15 = *(undefined8 *)in[local_66c * 8 + 7];
      uVar16 = *(undefined8 *)(in[local_66c * 8 + 7] + 2);
      local_4f8 = (float)uVar1;
      fStack_4f4 = (float)((ulong)uVar1 >> 0x20);
      fStack_4f0 = (float)uVar2;
      fStack_4ec = (float)((ulong)uVar2 >> 0x20);
      local_508 = (float)uVar9;
      fStack_504 = (float)((ulong)uVar9 >> 0x20);
      fStack_500 = (float)uVar10;
      fStack_4fc = (float)((ulong)uVar10 >> 0x20);
      local_518 = (float)uVar5;
      fStack_514 = (float)((ulong)uVar5 >> 0x20);
      fStack_510 = (float)uVar6;
      fStack_50c = (float)((ulong)uVar6 >> 0x20);
      local_528 = (float)uVar13;
      fStack_524 = (float)((ulong)uVar13 >> 0x20);
      fStack_520 = (float)uVar14;
      fStack_51c = (float)((ulong)uVar14 >> 0x20);
      local_538 = (float)uVar3;
      fStack_534 = (float)((ulong)uVar3 >> 0x20);
      fStack_530 = (float)uVar4;
      fStack_52c = (float)((ulong)uVar4 >> 0x20);
      local_548 = (float)uVar11;
      fStack_544 = (float)((ulong)uVar11 >> 0x20);
      fStack_540 = (float)uVar12;
      fStack_53c = (float)((ulong)uVar12 >> 0x20);
      local_558 = (float)uVar7;
      fStack_554 = (float)((ulong)uVar7 >> 0x20);
      fStack_550 = (float)uVar8;
      fStack_54c = (float)((ulong)uVar8 >> 0x20);
      local_568 = (float)uVar15;
      fStack_564 = (float)((ulong)uVar15 >> 0x20);
      fStack_560 = (float)uVar16;
      fStack_55c = (float)((ulong)uVar16 >> 0x20);
      fVar17 = (local_4f8 - local_508) - (local_558 - local_568);
      fVar23 = (fStack_4f4 - fStack_504) - (fStack_554 - fStack_564);
      fVar29 = (fStack_4f0 - fStack_500) - (fStack_550 - fStack_560);
      fVar35 = (fStack_4ec - fStack_4fc) - (fStack_54c - fStack_55c);
      fVar18 = (local_538 - local_548) + (local_518 - local_528);
      fVar24 = (fStack_534 - fStack_544) + (fStack_514 - fStack_524);
      fVar30 = (fStack_530 - fStack_540) + (fStack_510 - fStack_520);
      fVar36 = (fStack_52c - fStack_53c) + (fStack_50c - fStack_51c);
      fVar19 = (local_4f8 + local_508) - (local_518 + local_528);
      fVar25 = (fStack_4f4 + fStack_504) - (fStack_514 + fStack_524);
      fVar31 = (fStack_4f0 + fStack_500) - (fStack_510 + fStack_520);
      fVar37 = (fStack_4ec + fStack_4fc) - (fStack_50c + fStack_51c);
      fVar20 = (local_538 + local_548) - (local_558 + local_568);
      fVar26 = (fStack_534 + fStack_544) - (fStack_554 + fStack_564);
      fVar32 = (fStack_530 + fStack_540) - (fStack_550 + fStack_560);
      fVar38 = (fStack_52c + fStack_53c) - (fStack_54c + fStack_55c);
      fVar21 = (local_4f8 - local_508) + (local_558 - local_568);
      fVar27 = (fStack_4f4 - fStack_504) + (fStack_554 - fStack_564);
      fVar33 = (fStack_4f0 - fStack_500) + (fStack_550 - fStack_560);
      fVar39 = (fStack_4ec - fStack_4fc) + (fStack_54c - fStack_55c);
      fVar22 = (local_538 - local_548) - (local_518 - local_528);
      fVar28 = (fStack_534 - fStack_544) - (fStack_514 - fStack_524);
      fVar34 = (fStack_530 - fStack_540) - (fStack_510 - fStack_520);
      fVar40 = (fStack_52c - fStack_53c) - (fStack_50c - fStack_51c);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 1];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 1] + 2);
      local_388 = (float)uVar1;
      fStack_384 = (float)((ulong)uVar1 >> 0x20);
      fStack_380 = (float)uVar2;
      fStack_37c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6];
      uVar2 = *(undefined8 *)(e[local_66c * 6] + 2);
      local_3a8 = (float)uVar1;
      fStack_3a4 = (float)((ulong)uVar1 >> 0x20);
      fStack_3a0 = (float)uVar2;
      fStack_39c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 1];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 1] + 2);
      local_3c8 = (float)uVar1;
      fStack_3c4 = (float)((ulong)uVar1 >> 0x20);
      fStack_3c0 = (float)uVar2;
      fStack_3bc = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6];
      uVar2 = *(undefined8 *)(e[local_66c * 6] + 2);
      local_3e8 = (float)uVar1;
      fStack_3e4 = (float)((ulong)uVar1 >> 0x20);
      fStack_3e0 = (float)uVar2;
      fStack_3dc = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 3];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 3] + 2);
      local_408 = (float)uVar1;
      fStack_404 = (float)((ulong)uVar1 >> 0x20);
      fStack_400 = (float)uVar2;
      fStack_3fc = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 2];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 2] + 2);
      local_428 = (float)uVar1;
      fStack_424 = (float)((ulong)uVar1 >> 0x20);
      fStack_420 = (float)uVar2;
      fStack_41c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 3];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 3] + 2);
      local_448 = (float)uVar1;
      fStack_444 = (float)((ulong)uVar1 >> 0x20);
      fStack_440 = (float)uVar2;
      fStack_43c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 2];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 2] + 2);
      local_468 = (float)uVar1;
      fStack_464 = (float)((ulong)uVar1 >> 0x20);
      fStack_460 = (float)uVar2;
      fStack_45c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 5];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 5] + 2);
      local_488 = (float)uVar1;
      fStack_484 = (float)((ulong)uVar1 >> 0x20);
      fStack_480 = (float)uVar2;
      fStack_47c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 4];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 4] + 2);
      local_4a8 = (float)uVar1;
      fStack_4a4 = (float)((ulong)uVar1 >> 0x20);
      fStack_4a0 = (float)uVar2;
      fStack_49c = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 5];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 5] + 2);
      local_4c8 = (float)uVar1;
      fStack_4c4 = (float)((ulong)uVar1 >> 0x20);
      fStack_4c0 = (float)uVar2;
      fStack_4bc = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)e[local_66c * 6 + 4];
      uVar2 = *(undefined8 *)(e[local_66c * 6 + 4] + 2);
      local_4e8 = (float)uVar1;
      fStack_4e4 = (float)((ulong)uVar1 >> 0x20);
      fStack_4e0 = (float)uVar2;
      fStack_4dc = (float)((ulong)uVar2 >> 0x20);
      i0[3] = fVar17 * local_3a8 + fVar18 * local_3c8;
      i0[2] = local_4f8 + local_508 + local_518 + local_528;
      r0[1] = fVar21 * local_4a8 + fVar22 * local_4c8;
      r0[0] = fVar19 * local_428 + fVar20 * local_448;
      i1[3] = fVar23 * fStack_3a4 + fVar24 * fStack_3c4;
      i1[2] = fStack_4f4 + fStack_504 + fStack_514 + fStack_524;
      r1[1] = fVar27 * fStack_4a4 + fVar28 * fStack_4c4;
      r1[0] = fVar25 * fStack_424 + fVar26 * fStack_444;
      i2[3] = fVar29 * fStack_3a0 + fVar30 * fStack_3c0;
      i2[2] = fStack_4f0 + fStack_500 + fStack_510 + fStack_520;
      r2[1] = fVar33 * fStack_4a0 + fVar34 * fStack_4c0;
      r2[0] = fVar31 * fStack_420 + fVar32 * fStack_440;
      i3[3] = fVar35 * fStack_39c + fVar36 * fStack_3bc;
      i3[2] = fStack_4ec + fStack_4fc + fStack_50c + fStack_51c;
      r3[1] = fVar39 * fStack_49c + fVar40 * fStack_4bc;
      r3[0] = fVar37 * fStack_41c + fVar38 * fStack_43c;
      r1[3] = fVar18 * local_3e8 - fVar17 * local_388;
      r1[2] = local_538 + local_548 + local_558 + local_568;
      i0[1] = fVar22 * local_4e8 - fVar21 * local_488;
      i0[0] = fVar20 * local_468 - fVar19 * local_408;
      r2[3] = fVar24 * fStack_3e4 - fVar23 * fStack_384;
      r2[2] = fStack_534 + fStack_544 + fStack_554 + fStack_564;
      i1[1] = fVar28 * fStack_4e4 - fVar27 * fStack_484;
      i1[0] = fVar26 * fStack_464 - fVar25 * fStack_404;
      r3[3] = fVar30 * fStack_3e0 - fVar29 * fStack_380;
      r3[2] = fStack_530 + fStack_540 + fStack_550 + fStack_560;
      i2[1] = fVar34 * fStack_4e0 - fVar33 * fStack_480;
      i2[0] = fVar32 * fStack_460 - fVar31 * fStack_400;
      sr0[3] = fVar36 * fStack_3dc - fVar35 * fStack_37c;
      sr0[2] = fStack_52c + fStack_53c + fStack_54c + fStack_55c;
      i3[1] = fVar40 * fStack_4dc - fVar39 * fStack_47c;
      i3[0] = fVar38 * fStack_45c - fVar37 * fStack_3fc;
      *(undefined8 *)*e_local = i0._8_8_;
      *(undefined8 *)(*e_local + 2) = r0._0_8_;
      *(undefined8 *)e_local[1] = r1._8_8_;
      *(undefined8 *)(e_local[1] + 2) = i0._0_8_;
      *(undefined8 *)e_local[2] = i1._8_8_;
      *(undefined8 *)(e_local[2] + 2) = r1._0_8_;
      *(undefined8 *)e_local[3] = r2._8_8_;
      *(undefined8 *)(e_local[3] + 2) = i1._0_8_;
      *(undefined8 *)e_local[4] = i2._8_8_;
      *(undefined8 *)(e_local[4] + 2) = r2._0_8_;
      *(undefined8 *)e_local[5] = r3._8_8_;
      *(undefined8 *)(e_local[5] + 2) = i2._0_8_;
      *(undefined8 *)e_local[6] = i3._8_8_;
      *(undefined8 *)(e_local[6] + 2) = r3._0_8_;
      *(undefined8 *)e_local[7] = sr0._8_8_;
      *(undefined8 *)(e_local[7] + 2) = i3._0_8_;
      e_local = e_local + 8;
    }
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x56b,"void pffft_cplx_preprocess(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

void pffft_cplx_preprocess(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  v4sf r0, i0, r1, i1, r2, i2, r3, i3;
  v4sf sr0, dr0, sr1, dr1, si0, di0, si1, di1;
  assert(in != out);
  for (k=0; k < dk; ++k) {    
    r0 = in[8*k+0]; i0 = in[8*k+1];
    r1 = in[8*k+2]; i1 = in[8*k+3];
    r2 = in[8*k+4]; i2 = in[8*k+5];
    r3 = in[8*k+6]; i3 = in[8*k+7];

    sr0 = VADD(r0,r2); dr0 = VSUB(r0, r2);
    sr1 = VADD(r1,r3); dr1 = VSUB(r1, r3);
    si0 = VADD(i0,i2); di0 = VSUB(i0, i2);
    si1 = VADD(i1,i3); di1 = VSUB(i1, i3);

    r0 = VADD(sr0, sr1); i0 = VADD(si0, si1);
    r1 = VSUB(dr0, di1); i1 = VADD(di0, dr1);
    r2 = VSUB(sr0, sr1); i2 = VSUB(si0, si1);
    r3 = VADD(dr0, di1); i3 = VSUB(di0, dr1);

    VCPLXMULCONJ(r1,i1,e[k*6+0],e[k*6+1]);
    VCPLXMULCONJ(r2,i2,e[k*6+2],e[k*6+3]);
    VCPLXMULCONJ(r3,i3,e[k*6+4],e[k*6+5]);

    VTRANSPOSE4(r0,r1,r2,r3);
    VTRANSPOSE4(i0,i1,i2,i3);

    *out++ = r0; *out++ = i0; *out++ = r1; *out++ = i1;
    *out++ = r2; *out++ = i2; *out++ = r3; *out++ = i3;
  }
}